

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

iterator __thiscall
ft::list<int,_ft::allocator<int>_>::insert
          (list<int,_ft::allocator<int>_> *this,iterator *position,value_type_conflict *val)

{
  listNode<int> *plVar1;
  listNode<int> *this_00;
  int *in_RCX;
  Node *extraout_RDX;
  iterator iVar2;
  listNode<int> local_48;
  
  this_00 = (listNode<int> *)operator_new(0x18);
  local_48.data = *in_RCX;
  local_48.prev = (listNode<int> *)0x0;
  local_48.next = (listNode<int> *)0x0;
  listNode<int>::listNode(this_00,&local_48);
  plVar1 = *(listNode<int> **)(val + 2);
  this_00->next = plVar1;
  plVar1 = plVar1->prev;
  this_00->prev = plVar1;
  plVar1->next = this_00;
  this_00->next->prev = this_00;
  position[1]._vptr_listIterator = (_func_int **)((long)position[1]._vptr_listIterator + 1);
  this->m_head = (node *)&PTR__listIterator_0010dd60;
  this->m_tail = this_00;
  iVar2.m_node = extraout_RDX;
  iVar2._vptr_listIterator = (_func_int **)this;
  return iVar2;
}

Assistant:

iterator	insert(iterator position, value_type const & val) {
		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);
		newNode->next = position.node();
		newNode->prev = position.node()->prev;
		newNode->prev->next = newNode;
		newNode->next->prev = newNode;
		++this->m_size;
		return iterator(newNode);
	}